

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DearchiverBase.cpp
# Opt level: O0

bool __thiscall Diligent::DearchiverBase::Store(DearchiverBase *this,IDataBlob **ppArchive)

{
  bool bVar1;
  Char *pCVar2;
  const_reference this_00;
  pointer this_01;
  reference this_02;
  type Src;
  Uint32 local_1a0;
  ArchiveData *Archive;
  const_iterator __end2;
  const_iterator __begin2;
  vector<Diligent::DearchiverBase::ArchiveData,_std::allocator<Diligent::DearchiverBase::ArchiveData>_>
  *__range2;
  DeviceObjectArchive MergedArchive;
  string msg_1;
  undefined1 local_40 [8];
  string msg;
  IDataBlob **ppArchive_local;
  DearchiverBase *this_local;
  
  msg.field_2._8_8_ = ppArchive;
  if (ppArchive == (IDataBlob **)0x0) {
    FormatString<char[27]>((string *)local_40,(char (*) [27])"ppArchive must not be null");
    pCVar2 = (Char *)std::__cxx11::string::c_str();
    DebugAssertionFailed
              (pCVar2,"Store",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/DearchiverBase.cpp"
               ,0x361);
    std::__cxx11::string::~string((string *)local_40);
    this_local._7_1_ = false;
  }
  else {
    if (*ppArchive != (IDataBlob *)0x0) {
      FormatString<char[125]>
                ((string *)&MergedArchive.m_ContentVersion,
                 (char (*) [125])
                 "*ppArchive must be null - make sure you are not overwriting reference to an existing object as this will cause memory leaks."
                );
      pCVar2 = (Char *)std::__cxx11::string::c_str();
      DebugAssertionFailed
                (pCVar2,"Store",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/DearchiverBase.cpp"
                 ,0x365);
      std::__cxx11::string::~string((string *)&MergedArchive.m_ContentVersion);
    }
    bVar1 = std::
            vector<Diligent::DearchiverBase::ArchiveData,_std::allocator<Diligent::DearchiverBase::ArchiveData>_>
            ::empty(&this->m_Archives);
    if (bVar1) {
      local_1a0 = 0;
    }
    else {
      this_00 = std::
                vector<Diligent::DearchiverBase::ArchiveData,_std::allocator<Diligent::DearchiverBase::ArchiveData>_>
                ::front(&this->m_Archives);
      this_01 = std::
                unique_ptr<const_Diligent::DeviceObjectArchive,_std::default_delete<const_Diligent::DeviceObjectArchive>_>
                ::operator->(&this_00->pObjArchive);
      local_1a0 = DeviceObjectArchive::GetContentVersion(this_01);
    }
    DeviceObjectArchive::DeviceObjectArchive((DeviceObjectArchive *)&__range2,local_1a0);
    __end2 = std::
             vector<Diligent::DearchiverBase::ArchiveData,_std::allocator<Diligent::DearchiverBase::ArchiveData>_>
             ::begin(&this->m_Archives);
    Archive = (ArchiveData *)
              std::
              vector<Diligent::DearchiverBase::ArchiveData,_std::allocator<Diligent::DearchiverBase::ArchiveData>_>
              ::end(&this->m_Archives);
    while (bVar1 = __gnu_cxx::operator!=
                             (&__end2,(__normal_iterator<const_Diligent::DearchiverBase::ArchiveData_*,_std::vector<Diligent::DearchiverBase::ArchiveData,_std::allocator<Diligent::DearchiverBase::ArchiveData>_>_>
                                       *)&Archive), bVar1) {
      this_02 = __gnu_cxx::
                __normal_iterator<const_Diligent::DearchiverBase::ArchiveData_*,_std::vector<Diligent::DearchiverBase::ArchiveData,_std::allocator<Diligent::DearchiverBase::ArchiveData>_>_>
                ::operator*(&__end2);
      bVar1 = std::unique_ptr::operator_cast_to_bool((unique_ptr *)this_02);
      if (bVar1) {
        Src = std::
              unique_ptr<const_Diligent::DeviceObjectArchive,_std::default_delete<const_Diligent::DeviceObjectArchive>_>
              ::operator*(&this_02->pObjArchive);
        DeviceObjectArchive::Merge((DeviceObjectArchive *)&__range2,Src);
      }
      __gnu_cxx::
      __normal_iterator<const_Diligent::DearchiverBase::ArchiveData_*,_std::vector<Diligent::DearchiverBase::ArchiveData,_std::allocator<Diligent::DearchiverBase::ArchiveData>_>_>
      ::operator++(&__end2);
    }
    DeviceObjectArchive::Serialize((DeviceObjectArchive *)&__range2,(IDataBlob **)msg.field_2._8_8_)
    ;
    this_local._7_1_ = *(long *)msg.field_2._8_8_ != 0;
    DeviceObjectArchive::~DeviceObjectArchive((DeviceObjectArchive *)&__range2);
  }
  return this_local._7_1_;
}

Assistant:

bool DearchiverBase::Store(IDataBlob** ppArchive) const
{
    if (ppArchive == nullptr)
    {
        DEV_ERROR("ppArchive must not be null");
        return false;
    }
    DEV_CHECK_ERR(*ppArchive == nullptr, "*ppArchive must be null - make sure you are not overwriting "
                                         "reference to an existing object as this will cause memory leaks.");

    try
    {
        DeviceObjectArchive MergedArchive{!m_Archives.empty() ? m_Archives.front().pObjArchive->GetContentVersion() : 0};
        for (const ArchiveData& Archive : m_Archives)
        {
            if (Archive.pObjArchive)
                MergedArchive.Merge(*Archive.pObjArchive);
        }

        MergedArchive.Serialize(ppArchive);
        return *ppArchive != nullptr;
    }
    catch (...)
    {
        return false;
    }
}